

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1driver.c
# Opt level: O1

FT_Long t1_ps_get_font_value
                  (FT_Face face,PS_Dict_Keys key,FT_UInt idx,void *value,FT_Long value_len_)

{
  uint uVar1;
  uint uVar2;
  FT_Library __s;
  long lVar3;
  undefined1 uVar4;
  undefined2 uVar5;
  undefined4 uVar6;
  size_t *psVar7;
  size_t sVar8;
  FT_Driver pFVar9;
  size_t sVar10;
  ulong __n;
  FT_Face __src;
  ulong uVar11;
  char *__s_00;
  bool bVar12;
  
  __n = 0;
  uVar11 = 0;
  if (0 < value_len_) {
    uVar11 = value_len_;
  }
  switch(key) {
  case PS_DICT_FONT_TYPE:
    __n = 1;
    if (value_len_ < 1 || value == (void *)0x0) goto switchD_002636d3_default;
    uVar4 = *(undefined1 *)((long)&face[2].driver + 1);
    goto LAB_00263e4f;
  case PS_DICT_FONT_MATRIX:
    if (3 < idx) break;
    __n = 8;
    if (value_len_ < 8 || value == (void *)0x0) goto switchD_002636d3_default;
    pFVar9 = (FT_Driver)(&face[2].memory)[idx];
    goto LAB_00263cc1;
  case PS_DICT_FONT_BBOX:
    if (3 < idx) break;
    __n = 8;
    if (value_len_ < 8 || value == (void *)0x0) goto switchD_002636d3_default;
    pFVar9 = (FT_Driver)(&face[2].extensions)[idx];
    goto LAB_00263cc1;
  case PS_DICT_PAINT_TYPE:
    __n = 1;
    if (value_len_ < 1 || value == (void *)0x0) goto switchD_002636d3_default;
    uVar4 = *(undefined1 *)&face[2].driver;
    goto LAB_00263e4f;
  case PS_DICT_FONT_NAME:
    __s_00 = face[2].family_name;
    goto LAB_00263dfc;
  case PS_DICT_UNIQUE_ID:
    __n = 4;
    if (value_len_ < 4 || value == (void *)0x0) goto switchD_002636d3_default;
    uVar6 = *(undefined4 *)&face[1].available_sizes;
    goto LAB_00263b7d;
  case PS_DICT_NUM_CHAR_STRINGS:
    __n = 4;
    if (value_len_ < 4 || value == (void *)0x0) goto switchD_002636d3_default;
    uVar6._0_2_ = face[2].max_advance_width;
    uVar6._2_2_ = face[2].max_advance_height;
    goto LAB_00263b7d;
  case PS_DICT_CHAR_STRING_KEY:
    uVar1._0_2_ = face[2].max_advance_width;
    uVar1._2_2_ = face[2].max_advance_height;
    if (idx < uVar1) {
      __s = (&(face[2].glyph)->library)[idx];
      sVar8 = strlen((char *)__s);
      __n = sVar8 + 1;
      sVar10 = __n;
joined_r0x00263be1:
      if ((value != (void *)0x0) && (__n <= uVar11)) {
        memcpy(value,__s,sVar10);
        *(undefined1 *)((long)value + sVar8) = 0;
      }
      goto switchD_002636d3_default;
    }
    break;
  case PS_DICT_CHAR_STRING:
    uVar2._0_2_ = face[2].max_advance_width;
    uVar2._2_2_ = face[2].max_advance_height;
    if (idx < uVar2) {
      __n = (ulong)(*(int *)((long)&(face[2].charmap)->face + (ulong)idx * 4) + 1);
      if ((value == (void *)0x0) || (uVar11 < __n)) goto switchD_002636d3_default;
      __src = (&(face[2].size)->face)[idx];
LAB_00263e8a:
      memcpy(value,__src,__n - 1);
      *(undefined1 *)((long)value + (__n - 1)) = 0;
      goto switchD_002636d3_default;
    }
    break;
  case PS_DICT_ENCODING_TYPE:
    __n = 4;
    if (value_len_ < 4 || value == (void *)0x0) goto switchD_002636d3_default;
    uVar6 = *(undefined4 *)&face[2].style_name;
    goto LAB_00263b7d;
  case PS_DICT_ENCODING_ENTRY:
    if ((*(int *)&face[2].style_name == 1) && (idx < (uint)face[2].num_fixed_sizes)) {
      __s = (FT_Library)face[2].charmaps[idx];
      sVar8 = strlen((char *)__s);
      __n = sVar8 + 1;
      sVar10 = sVar8;
      goto joined_r0x00263be1;
    }
    break;
  case PS_DICT_NUM_SUBRS:
    __n = 4;
    if (value_len_ < 4 || value == (void *)0x0) goto switchD_002636d3_default;
    uVar6 = (undefined4)face[2].bbox.yMin;
    goto LAB_00263b7d;
  case PS_DICT_SUBR:
    if (*(FT_Hash *)&face[2].units_per_EM == (FT_Hash)0x0) {
      bVar12 = (uint)face[2].bbox.yMin <= idx;
    }
    else {
      psVar7 = ft_hash_num_lookup(idx,*(FT_Hash *)&face[2].units_per_EM);
      bVar12 = psVar7 == (size_t *)0x0;
      if (!bVar12) {
        idx = (FT_UInt)*psVar7;
        bVar12 = false;
      }
    }
    if ((!bVar12) && (lVar3 = face[2].bbox.xMax, lVar3 != 0)) {
      __n = (ulong)(*(int *)(face[2].bbox.yMax + (ulong)idx * 4) + 1);
      if ((value == (void *)0x0) || (uVar11 < __n)) goto switchD_002636d3_default;
      __src = *(FT_Face *)(lVar3 + (ulong)idx * 8);
      goto LAB_00263e8a;
    }
    break;
  case PS_DICT_STD_HW:
    __n = 2;
    if (value_len_ < 2 || value == (void *)0x0) goto switchD_002636d3_default;
    uVar5 = *(undefined2 *)&face[1].stream;
    goto LAB_00263dec;
  case PS_DICT_STD_VW:
    __n = 2;
    if (value_len_ < 2 || value == (void *)0x0) goto switchD_002636d3_default;
    uVar5 = *(undefined2 *)((long)&face[1].stream + 2);
    goto LAB_00263dec;
  case PS_DICT_NUM_BLUE_VALUES:
    __n = 1;
    if (value_len_ < 1 || value == (void *)0x0) goto switchD_002636d3_default;
    uVar4 = (undefined1)face[1].num_charmaps;
    goto LAB_00263e4f;
  case PS_DICT_BLUE_VALUE:
    if (idx < (byte)face[1].num_charmaps) {
      __n = 2;
      if (value_len_ < 2 || value == (void *)0x0) goto switchD_002636d3_default;
      uVar5 = *(undefined2 *)(&face[1].field_0x4c + (ulong)idx * 2);
      goto LAB_00263dec;
    }
    break;
  case PS_DICT_BLUE_FUZZ:
    __n = 4;
    if (value_len_ < 4 || value == (void *)0x0) goto switchD_002636d3_default;
    uVar6 = *(undefined4 *)((long)&face[1].memory + 4);
    goto LAB_00263b7d;
  case PS_DICT_NUM_OTHER_BLUES:
    __n = 1;
    if (value_len_ < 1 || value == (void *)0x0) goto switchD_002636d3_default;
    uVar4 = *(undefined1 *)((long)&face[1].num_charmaps + 1);
    goto LAB_00263e4f;
  case PS_DICT_OTHER_BLUE:
    if (idx < *(byte *)((long)&face[1].num_charmaps + 1)) {
      __n = 2;
      if (value_len_ < 2 || value == (void *)0x0) goto switchD_002636d3_default;
      uVar5 = *(undefined2 *)((long)&face[1].bbox.xMin + (ulong)idx * 2);
      goto LAB_00263dec;
    }
    break;
  case PS_DICT_NUM_FAMILY_BLUES:
    __n = 1;
    if (value_len_ < 1 || value == (void *)0x0) goto switchD_002636d3_default;
    uVar4 = *(undefined1 *)((long)&face[1].num_charmaps + 2);
    goto LAB_00263e4f;
  case PS_DICT_FAMILY_BLUE:
    if (idx < *(byte *)((long)&face[1].num_charmaps + 2)) {
      __n = 2;
      if (value_len_ < 2 || value == (void *)0x0) goto switchD_002636d3_default;
      uVar5 = *(undefined2 *)((long)&face[1].bbox.xMax + (ulong)idx * 2 + 4);
      goto LAB_00263dec;
    }
    break;
  case PS_DICT_NUM_FAMILY_OTHER_BLUES:
    __n = 1;
    if (value_len_ < 1 || value == (void *)0x0) goto switchD_002636d3_default;
    uVar4 = *(undefined1 *)((long)&face[1].num_charmaps + 3);
    goto LAB_00263e4f;
  case PS_DICT_FAMILY_OTHER_BLUE:
    if (idx < *(byte *)((long)&face[1].num_charmaps + 3)) {
      __n = 2;
      if (value_len_ < 2 || value == (void *)0x0) goto switchD_002636d3_default;
      uVar5 = *(undefined2 *)((long)&face[1].glyph + (ulong)idx * 2);
      goto LAB_00263dec;
    }
    break;
  case PS_DICT_BLUE_SCALE:
    __n = 8;
    if (value_len_ < 8 || value == (void *)0x0) goto switchD_002636d3_default;
    pFVar9 = face[1].driver;
    goto LAB_00263cc1;
  case PS_DICT_BLUE_SHIFT:
    __n = 4;
    if (value_len_ < 4 || value == (void *)0x0) goto switchD_002636d3_default;
    uVar6 = *(undefined4 *)&face[1].memory;
    goto LAB_00263b7d;
  case PS_DICT_NUM_STEM_SNAP_H:
    __n = 1;
    if (value_len_ < 1 || value == (void *)0x0) goto switchD_002636d3_default;
    uVar4 = *(undefined1 *)((long)&face[1].stream + 4);
    goto LAB_00263e4f;
  case PS_DICT_STEM_SNAP_H:
    if (idx < *(byte *)((long)&face[1].stream + 4)) {
      __n = 2;
      if (value_len_ < 2 || value == (void *)0x0) goto switchD_002636d3_default;
      uVar5 = *(undefined2 *)((long)&face[1].sizes_list.head + (ulong)idx * 2);
      goto LAB_00263dec;
    }
    break;
  case PS_DICT_NUM_STEM_SNAP_V:
    __n = 1;
    if (value_len_ < 1 || value == (void *)0x0) goto switchD_002636d3_default;
    uVar4 = *(undefined1 *)((long)&face[1].stream + 5);
    goto LAB_00263e4f;
  case PS_DICT_STEM_SNAP_V:
    if (idx < *(byte *)((long)&face[1].stream + 5)) {
      __n = 2;
      if (value_len_ < 2 || value == (void *)0x0) goto switchD_002636d3_default;
      uVar5 = *(undefined2 *)((long)&face[1].autohint.finalizer + (ulong)idx * 2 + 2);
      goto LAB_00263dec;
    }
    break;
  case PS_DICT_FORCE_BOLD:
    __n = 1;
    if (value_len_ < 1 || value == (void *)0x0) goto switchD_002636d3_default;
    uVar4 = *(undefined1 *)((long)&face[1].stream + 6);
    goto LAB_00263e4f;
  case PS_DICT_RND_STEM_UP:
    __n = 1;
    if (value_len_ < 1 || value == (void *)0x0) goto switchD_002636d3_default;
    uVar4 = *(undefined1 *)((long)&face[1].stream + 7);
    goto LAB_00263e4f;
  case PS_DICT_MIN_FEATURE:
    if (idx < 2) {
      __n = 2;
      if (value_len_ < 2 || value == (void *)0x0) goto switchD_002636d3_default;
      uVar5 = *(undefined2 *)((long)&face[2].num_glyphs + (ulong)idx * 2);
      goto LAB_00263dec;
    }
    break;
  case PS_DICT_LEN_IV:
    __n = 4;
    if (value_len_ < 4 || value == (void *)0x0) goto switchD_002636d3_default;
    uVar6 = *(undefined4 *)((long)&face[1].available_sizes + 4);
LAB_00263b7d:
    __n = 4;
    *(undefined4 *)value = uVar6;
    goto switchD_002636d3_default;
  case PS_DICT_PASSWORD:
    __n = 8;
    if (value_len_ < 8 || value == (void *)0x0) goto switchD_002636d3_default;
    pFVar9 = (FT_Driver)face[2].style_flags;
    goto LAB_00263cc1;
  case PS_DICT_LANGUAGE_GROUP:
    __n = 8;
    if (value_len_ < 8 || value == (void *)0x0) goto switchD_002636d3_default;
    pFVar9 = (FT_Driver)face[2].face_flags;
    goto LAB_00263cc1;
  case PS_DICT_VERSION:
    __s_00 = (char *)face[1].num_faces;
    goto LAB_00263dfc;
  case PS_DICT_NOTICE:
    __s_00 = (char *)face[1].face_index;
    goto LAB_00263dfc;
  case PS_DICT_FULL_NAME:
    __s_00 = (char *)face[1].face_flags;
    goto LAB_00263dfc;
  case PS_DICT_FAMILY_NAME:
    __s_00 = (char *)face[1].style_flags;
    goto LAB_00263dfc;
  case PS_DICT_WEIGHT:
    __s_00 = (char *)face[1].num_glyphs;
LAB_00263dfc:
    if (__s_00 != (char *)0x0) {
      sVar10 = strlen(__s_00);
      __n = sVar10 + 1;
      if (__n <= uVar11 && value != (void *)0x0) {
        memcpy(value,__s_00,__n);
      }
      goto switchD_002636d3_default;
    }
    break;
  case PS_DICT_IS_FIXED_PITCH:
    __n = 1;
    if (value_len_ < 1 || value == (void *)0x0) goto switchD_002636d3_default;
    uVar4 = *(undefined1 *)&face[1].style_name;
LAB_00263e4f:
    __n = 1;
    *(undefined1 *)value = uVar4;
    goto switchD_002636d3_default;
  case PS_DICT_UNDERLINE_POSITION:
    __n = 2;
    if (value_len_ < 2 || value == (void *)0x0) goto switchD_002636d3_default;
    uVar5 = *(undefined2 *)((long)&face[1].style_name + 2);
    goto LAB_00263dec;
  case PS_DICT_UNDERLINE_THICKNESS:
    __n = 2;
    if (value_len_ < 2 || value == (void *)0x0) goto switchD_002636d3_default;
    uVar5 = *(undefined2 *)((long)&face[1].style_name + 4);
    goto LAB_00263dec;
  case PS_DICT_FS_TYPE:
    __n = 2;
    if (value_len_ < 2 || value == (void *)0x0) goto switchD_002636d3_default;
    uVar5 = (undefined2)face[1].num_fixed_sizes;
LAB_00263dec:
    __n = 2;
    *(undefined2 *)value = uVar5;
    goto switchD_002636d3_default;
  case PS_DICT_ITALIC_ANGLE:
    __n = 8;
    if (value_len_ < 8 || value == (void *)0x0) goto switchD_002636d3_default;
    pFVar9 = (FT_Driver)face[1].family_name;
LAB_00263cc1:
    __n = 8;
    *(FT_Driver *)value = pFVar9;
  default:
    goto switchD_002636d3_default;
  }
  __n = 0;
switchD_002636d3_default:
  return -(ulong)(__n == 0) | __n;
}

Assistant:

static FT_Long
  t1_ps_get_font_value( FT_Face       face,
                        PS_Dict_Keys  key,
                        FT_UInt       idx,
                        void         *value,
                        FT_Long       value_len_ )
  {
    FT_ULong  retval    = 0; /* always >= 1 if valid */
    FT_ULong  value_len = value_len_ < 0 ? 0 : (FT_ULong)value_len_;

    T1_Face  t1face = (T1_Face)face;
    T1_Font  type1  = &t1face->type1;


    switch ( key )
    {
    case PS_DICT_FONT_TYPE:
      retval = sizeof ( type1->font_type );
      if ( value && value_len >= retval )
        *((FT_Byte *)value) = type1->font_type;
      break;

    case PS_DICT_FONT_MATRIX:
      if ( idx < sizeof ( type1->font_matrix ) /
                   sizeof ( type1->font_matrix.xx ) )
      {
        FT_Fixed  val = 0;


        retval = sizeof ( val );
        if ( value && value_len >= retval )
        {
          switch ( idx )
          {
          case 0:
            val = type1->font_matrix.xx;
            break;
          case 1:
            val = type1->font_matrix.xy;
            break;
          case 2:
            val = type1->font_matrix.yx;
            break;
          case 3:
            val = type1->font_matrix.yy;
            break;
          }
          *((FT_Fixed *)value) = val;
        }
      }
      break;

    case PS_DICT_FONT_BBOX:
      if ( idx < sizeof ( type1->font_bbox ) /
                   sizeof ( type1->font_bbox.xMin ) )
      {
        FT_Fixed  val = 0;


        retval = sizeof ( val );
        if ( value && value_len >= retval )
        {
          switch ( idx )
          {
          case 0:
            val = type1->font_bbox.xMin;
            break;
          case 1:
            val = type1->font_bbox.yMin;
            break;
          case 2:
            val = type1->font_bbox.xMax;
            break;
          case 3:
            val = type1->font_bbox.yMax;
            break;
          }
          *((FT_Fixed *)value) = val;
        }
      }
      break;

    case PS_DICT_PAINT_TYPE:
      retval = sizeof ( type1->paint_type );
      if ( value && value_len >= retval )
        *((FT_Byte *)value) = type1->paint_type;
      break;

    case PS_DICT_FONT_NAME:
      if ( type1->font_name )
      {
        retval = ft_strlen( type1->font_name ) + 1;
        if ( value && value_len >= retval )
          ft_memcpy( value, (void *)( type1->font_name ), retval );
      }
      break;

    case PS_DICT_UNIQUE_ID:
      retval = sizeof ( type1->private_dict.unique_id );
      if ( value && value_len >= retval )
        *((FT_Int *)value) = type1->private_dict.unique_id;
      break;

    case PS_DICT_NUM_CHAR_STRINGS:
      retval = sizeof ( type1->num_glyphs );
      if ( value && value_len >= retval )
        *((FT_Int *)value) = type1->num_glyphs;
      break;

    case PS_DICT_CHAR_STRING_KEY:
      if ( idx < (FT_UInt)type1->num_glyphs )
      {
        retval = ft_strlen( type1->glyph_names[idx] ) + 1;
        if ( value && value_len >= retval )
        {
          ft_memcpy( value, (void *)( type1->glyph_names[idx] ), retval );
          ((FT_Char *)value)[retval - 1] = (FT_Char)'\0';
        }
      }
      break;

    case PS_DICT_CHAR_STRING:
      if ( idx < (FT_UInt)type1->num_glyphs )
      {
        retval = type1->charstrings_len[idx] + 1;
        if ( value && value_len >= retval )
        {
          ft_memcpy( value, (void *)( type1->charstrings[idx] ),
                     retval - 1 );
          ((FT_Char *)value)[retval - 1] = (FT_Char)'\0';
        }
      }
      break;

    case PS_DICT_ENCODING_TYPE:
      retval = sizeof ( type1->encoding_type );
      if ( value && value_len >= retval )
        *((T1_EncodingType *)value) = type1->encoding_type;
      break;

    case PS_DICT_ENCODING_ENTRY:
      if ( type1->encoding_type == T1_ENCODING_TYPE_ARRAY &&
           idx < (FT_UInt)type1->encoding.num_chars       )
      {
        retval = ft_strlen( type1->encoding.char_name[idx] ) + 1;
        if ( value && value_len >= retval )
        {
          ft_memcpy( value, (void *)( type1->encoding.char_name[idx] ),
                     retval - 1 );
          ((FT_Char *)value)[retval - 1] = (FT_Char)'\0';
        }
      }
      break;

    case PS_DICT_NUM_SUBRS:
      retval = sizeof ( type1->num_subrs );
      if ( value && value_len >= retval )
        *((FT_Int *)value) = type1->num_subrs;
      break;

    case PS_DICT_SUBR:
      {
        FT_Bool  ok = 0;


        if ( type1->subrs_hash )
        {
          /* convert subr index to array index */
          size_t*  val = ft_hash_num_lookup( (FT_Int)idx,
                                             type1->subrs_hash );


          if ( val )
          {
            idx = *val;
            ok  = 1;
          }
        }
        else
        {
          if ( idx < (FT_UInt)type1->num_subrs )
            ok = 1;
        }

        if ( ok && type1->subrs )
        {
          retval = type1->subrs_len[idx] + 1;
          if ( value && value_len >= retval )
          {
            ft_memcpy( value, (void *)( type1->subrs[idx] ), retval - 1 );
            ((FT_Char *)value)[retval - 1] = (FT_Char)'\0';
          }
        }
      }
      break;

    case PS_DICT_STD_HW:
      retval = sizeof ( type1->private_dict.standard_width[0] );
      if ( value && value_len >= retval )
        *((FT_UShort *)value) = type1->private_dict.standard_width[0];
      break;

    case PS_DICT_STD_VW:
      retval = sizeof ( type1->private_dict.standard_height[0] );
      if ( value && value_len >= retval )
        *((FT_UShort *)value) = type1->private_dict.standard_height[0];
      break;

    case PS_DICT_NUM_BLUE_VALUES:
      retval = sizeof ( type1->private_dict.num_blue_values );
      if ( value && value_len >= retval )
        *((FT_Byte *)value) = type1->private_dict.num_blue_values;
      break;

    case PS_DICT_BLUE_VALUE:
      if ( idx < type1->private_dict.num_blue_values )
      {
        retval = sizeof ( type1->private_dict.blue_values[idx] );
        if ( value && value_len >= retval )
          *((FT_Short *)value) = type1->private_dict.blue_values[idx];
      }
      break;

    case PS_DICT_BLUE_SCALE:
      retval = sizeof ( type1->private_dict.blue_scale );
      if ( value && value_len >= retval )
        *((FT_Fixed *)value) = type1->private_dict.blue_scale;
      break;

    case PS_DICT_BLUE_FUZZ:
      retval = sizeof ( type1->private_dict.blue_fuzz );
      if ( value && value_len >= retval )
        *((FT_Int *)value) = type1->private_dict.blue_fuzz;
      break;

    case PS_DICT_BLUE_SHIFT:
      retval = sizeof ( type1->private_dict.blue_shift );
      if ( value && value_len >= retval )
        *((FT_Int *)value) = type1->private_dict.blue_shift;
      break;

    case PS_DICT_NUM_OTHER_BLUES:
      retval = sizeof ( type1->private_dict.num_other_blues );
      if ( value && value_len >= retval )
        *((FT_Byte *)value) = type1->private_dict.num_other_blues;
      break;

    case PS_DICT_OTHER_BLUE:
      if ( idx < type1->private_dict.num_other_blues )
      {
        retval = sizeof ( type1->private_dict.other_blues[idx] );
        if ( value && value_len >= retval )
          *((FT_Short *)value) = type1->private_dict.other_blues[idx];
      }
      break;

    case PS_DICT_NUM_FAMILY_BLUES:
      retval = sizeof ( type1->private_dict.num_family_blues );
      if ( value && value_len >= retval )
        *((FT_Byte *)value) = type1->private_dict.num_family_blues;
      break;

    case PS_DICT_FAMILY_BLUE:
      if ( idx < type1->private_dict.num_family_blues )
      {
        retval = sizeof ( type1->private_dict.family_blues[idx] );
        if ( value && value_len >= retval )
          *((FT_Short *)value) = type1->private_dict.family_blues[idx];
      }
      break;

    case PS_DICT_NUM_FAMILY_OTHER_BLUES:
      retval = sizeof ( type1->private_dict.num_family_other_blues );
      if ( value && value_len >= retval )
        *((FT_Byte *)value) = type1->private_dict.num_family_other_blues;
      break;

    case PS_DICT_FAMILY_OTHER_BLUE:
      if ( idx < type1->private_dict.num_family_other_blues )
      {
        retval = sizeof ( type1->private_dict.family_other_blues[idx] );
        if ( value && value_len >= retval )
          *((FT_Short *)value) = type1->private_dict.family_other_blues[idx];
      }
      break;

    case PS_DICT_NUM_STEM_SNAP_H:
      retval = sizeof ( type1->private_dict.num_snap_widths );
      if ( value && value_len >= retval )
        *((FT_Byte *)value) = type1->private_dict.num_snap_widths;
      break;

    case PS_DICT_STEM_SNAP_H:
      if ( idx < type1->private_dict.num_snap_widths )
      {
        retval = sizeof ( type1->private_dict.snap_widths[idx] );
        if ( value && value_len >= retval )
          *((FT_Short *)value) = type1->private_dict.snap_widths[idx];
      }
      break;

    case PS_DICT_NUM_STEM_SNAP_V:
      retval = sizeof ( type1->private_dict.num_snap_heights );
      if ( value && value_len >= retval )
        *((FT_Byte *)value) = type1->private_dict.num_snap_heights;
      break;

    case PS_DICT_STEM_SNAP_V:
      if ( idx < type1->private_dict.num_snap_heights )
      {
        retval = sizeof ( type1->private_dict.snap_heights[idx] );
        if ( value && value_len >= retval )
          *((FT_Short *)value) = type1->private_dict.snap_heights[idx];
      }
      break;

    case PS_DICT_RND_STEM_UP:
      retval = sizeof ( type1->private_dict.round_stem_up );
      if ( value && value_len >= retval )
        *((FT_Bool *)value) = type1->private_dict.round_stem_up;
      break;

    case PS_DICT_FORCE_BOLD:
      retval = sizeof ( type1->private_dict.force_bold );
      if ( value && value_len >= retval )
        *((FT_Bool *)value) = type1->private_dict.force_bold;
      break;

    case PS_DICT_MIN_FEATURE:
      if ( idx < sizeof ( type1->private_dict.min_feature ) /
                   sizeof ( type1->private_dict.min_feature[0] ) )
      {
        retval = sizeof ( type1->private_dict.min_feature[idx] );
        if ( value && value_len >= retval )
          *((FT_Short *)value) = type1->private_dict.min_feature[idx];
      }
      break;

    case PS_DICT_LEN_IV:
      retval = sizeof ( type1->private_dict.lenIV );
      if ( value && value_len >= retval )
        *((FT_Int *)value) = type1->private_dict.lenIV;
      break;

    case PS_DICT_PASSWORD:
      retval = sizeof ( type1->private_dict.password );
      if ( value && value_len >= retval )
        *((FT_Long *)value) = type1->private_dict.password;
      break;

    case PS_DICT_LANGUAGE_GROUP:
      retval = sizeof ( type1->private_dict.language_group );
      if ( value && value_len >= retval )
        *((FT_Long *)value) = type1->private_dict.language_group;
      break;

    case PS_DICT_IS_FIXED_PITCH:
      retval = sizeof ( type1->font_info.is_fixed_pitch );
      if ( value && value_len >= retval )
        *((FT_Bool *)value) = type1->font_info.is_fixed_pitch;
      break;

    case PS_DICT_UNDERLINE_POSITION:
      retval = sizeof ( type1->font_info.underline_position );
      if ( value && value_len >= retval )
        *((FT_Short *)value) = type1->font_info.underline_position;
      break;

    case PS_DICT_UNDERLINE_THICKNESS:
      retval = sizeof ( type1->font_info.underline_thickness );
      if ( value && value_len >= retval )
        *((FT_UShort *)value) = type1->font_info.underline_thickness;
      break;

    case PS_DICT_FS_TYPE:
      retval = sizeof ( type1->font_extra.fs_type );
      if ( value && value_len >= retval )
        *((FT_UShort *)value) = type1->font_extra.fs_type;
      break;

    case PS_DICT_VERSION:
      if ( type1->font_info.version )
      {
        retval = ft_strlen( type1->font_info.version ) + 1;
        if ( value && value_len >= retval )
          ft_memcpy( value, (void *)( type1->font_info.version ), retval );
      }
      break;

    case PS_DICT_NOTICE:
      if ( type1->font_info.notice )
      {
        retval = ft_strlen( type1->font_info.notice ) + 1;
        if ( value && value_len >= retval )
          ft_memcpy( value, (void *)( type1->font_info.notice ), retval );
      }
      break;

    case PS_DICT_FULL_NAME:
      if ( type1->font_info.full_name )
      {
        retval = ft_strlen( type1->font_info.full_name ) + 1;
        if ( value && value_len >= retval )
          ft_memcpy( value, (void *)( type1->font_info.full_name ), retval );
      }
      break;

    case PS_DICT_FAMILY_NAME:
      if ( type1->font_info.family_name )
      {
        retval = ft_strlen( type1->font_info.family_name ) + 1;
        if ( value && value_len >= retval )
          ft_memcpy( value, (void *)( type1->font_info.family_name ),
                     retval );
      }
      break;

    case PS_DICT_WEIGHT:
      if ( type1->font_info.weight )
      {
        retval = ft_strlen( type1->font_info.weight ) + 1;
        if ( value && value_len >= retval )
          ft_memcpy( value, (void *)( type1->font_info.weight ), retval );
      }
      break;

    case PS_DICT_ITALIC_ANGLE:
      retval = sizeof ( type1->font_info.italic_angle );
      if ( value && value_len >= retval )
        *((FT_Long *)value) = type1->font_info.italic_angle;
      break;
    }

    return retval == 0 ? -1 : (FT_Long)retval;
  }